

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

int setup_global(MIR_context_t ctx,char *name,void *addr,MIR_item_t_conflict def)

{
  MIR_module_t_conflict pMVar1;
  MIR_item_t_conflict item;
  char *name_00;
  MIR_item_t_conflict pMVar2;
  MIR_context_t ctx_00;
  bool bVar3;
  MIR_item_t_conflict local_38;
  
  pMVar1 = ctx->curr_module;
  ctx->curr_module = &ctx->environment_module;
  ctx_00 = ctx;
  item = new_export_import_forward(ctx,name,MIR_import_item,"import",1);
  name_00 = MIR_item_name(ctx_00,item);
  pMVar2 = item_tab_find(ctx,name_00,&ctx->environment_module);
  bVar3 = pMVar2 == item;
  local_38 = pMVar2;
  if (pMVar2 == (MIR_item_t_conflict)0x0 || bVar3) {
    HTAB_MIR_item_t_do(ctx->module_item_tab,item,HTAB_INSERT,&local_38);
    DLIST_MIR_item_t_append(&(ctx->environment_module).items,item);
  }
  else {
    free(item);
    item = pMVar2;
  }
  item->addr = addr;
  item->ref_def = def;
  ctx->curr_module = pMVar1;
  return (uint)(pMVar2 != (MIR_item_t_conflict)0x0 && !bVar3);
}

Assistant:

static int setup_global (MIR_context_t ctx, const char *name, void *addr, MIR_item_t def) {
  MIR_item_t item, tab_item;
  MIR_module_t saved = curr_module;
  int redef_p = FALSE;

  curr_module = &environment_module;
  /* Use import for proto representation: */
  item = new_export_import_forward (ctx, name, MIR_import_item, "import", TRUE);
  if ((tab_item = item_tab_find (ctx, MIR_item_name (ctx, item), &environment_module)) != item
      && tab_item != NULL) {
    free (item);
    redef_p = TRUE;
  } else {
    HTAB_DO (MIR_item_t, module_item_tab, item, HTAB_INSERT, tab_item);
    DLIST_APPEND (MIR_item_t, environment_module.items, item);
    tab_item = item;
  }
  tab_item->addr = addr;
  tab_item->ref_def = def;
  curr_module = saved;
  return redef_p;
}